

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistogramBasedDistribution.cpp
# Opt level: O0

void __thiscall
HistogramBasedDistribution::estimateGaussian
          (HistogramBasedDistribution *this,double *mean,double *stddev)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double dVar5;
  double p;
  int length;
  int end;
  int start;
  size_t i;
  double q75;
  bool q50_set;
  double q50;
  bool q25_set;
  double q25;
  double p_sum;
  int local_84;
  ulong local_50;
  double local_48;
  double local_38;
  double local_28;
  double local_20;
  
  local_20 = 0.0;
  local_28 = 0.0;
  local_38 = 0.0;
  local_48 = 0.0;
  local_50 = 0;
  do {
    sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                      ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       (in_RDI + 0x10));
    if (sVar3 <= local_50) {
LAB_002a0d92:
      *in_RSI = local_38;
      *in_RDX = ((local_48 - local_28) / 2.0) / 0.6744898;
      return;
    }
    pvVar4 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                        (in_RDI + 0x10),local_50);
    iVar1 = pvVar4->first;
    sVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                      ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       (in_RDI + 0x10));
    if (local_50 + 1 < sVar3) {
      pvVar4 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)(in_RDI + 0x10),local_50 + 1);
      local_84 = pvVar4->first + -1;
    }
    else {
      local_84 = *(int *)(in_RDI + 0xc);
    }
    iVar2 = (local_84 - iVar1) + 1;
    pvVar4 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                        (in_RDI + 0x10),local_50);
    dVar5 = pvVar4->second * (double)iVar2;
    if (0.25 <= local_20 + dVar5) {
      local_28 = (double)iVar1 + ((double)iVar2 * (0.25 - local_20)) / dVar5;
    }
    if (0.5 <= local_20 + dVar5) {
      local_38 = (double)iVar1 + ((double)iVar2 * (0.5 - local_20)) / dVar5;
    }
    if (0.75 <= local_20 + dVar5) {
      local_48 = (double)iVar1 + ((double)iVar2 * (0.75 - local_20)) / dVar5;
      goto LAB_002a0d92;
    }
    local_20 = dVar5 + local_20;
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

void HistogramBasedDistribution::estimateGaussian(double* mean, double* stddev) {
	double p_sum = 0.0;
	double q25 = 0;
	bool q25_set = false;
	double q50 = 0;
	bool q50_set = false;
	double q75 = 0;
	for (size_t i=0; i<values.size(); ++i) {
		int start = values[i].first;
		int end = (i+1 < values.size())? values[i+1].first-1:max;
		int length = end - start + 1;
		double p = values[i].second * length;
		if (!q25_set && (p_sum + p >= 0.25)) {
			q25 = start + ((double)length)*(0.25-p_sum)/p;
		}
		if (!q50_set && (p_sum + p >= 0.5)) {
			q50 = start + ((double)length)*(0.5-p_sum)/p;
		}
		if (p_sum + p >= 0.75) {
			q75 = start + ((double)length)*(0.75-p_sum)/p;
			break;
		}
		p_sum += p;
	}
	*mean = q50;
	*stddev = (q75 - q25) / 2 / 0.6744898;
}